

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printIf(JSPrinter *this,Ref node)

{
  size_t sVar1;
  bool bVar2;
  Ref *pRVar3;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  emit(this,"if");
  safeSpace(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  pRVar3 = Ref::operator[](&local_20,1);
  print(this,pRVar3->inst);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  space(this);
  pRVar3 = Ref::operator[](&local_20,2);
  bVar2 = isBlock(pRVar3->inst);
  if (bVar2) {
    pRVar3 = Ref::operator[](&local_20,2);
    print(this,pRVar3->inst);
  }
  else {
    maybeSpace(this,'{');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = '{';
    this->indent = this->indent + 1;
    newline(this);
    pRVar3 = Ref::operator[](&local_20,2);
    print(this,pRVar3->inst);
    this->indent = this->indent + -1;
    newline(this);
    emit(this,'}');
  }
  bVar2 = ifHasElse(local_20);
  if (bVar2) {
    space(this);
    emit(this,"else");
    safeSpace(this);
    pRVar3 = Ref::operator[](&local_20,3);
    bVar2 = isBlock(pRVar3->inst);
    if (bVar2) {
      pRVar3 = Ref::operator[](&local_20,3);
      print(this,pRVar3->inst);
    }
    else {
      maybeSpace(this,'{');
      ensure(this,1);
      sVar1 = this->used;
      this->used = sVar1 + 1;
      this->buffer[sVar1] = '{';
      this->indent = this->indent + 1;
      newline(this);
      pRVar3 = Ref::operator[](&local_20,3);
      print(this,pRVar3->inst);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
    }
  }
  return;
}

Assistant:

void printIf(Ref node) {
    emit("if");
    safeSpace();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    bool emitsBracesAnyhow = isBlock(node[2]);
    if (!emitsBracesAnyhow) {
      emit('{');
      indent++;
      newline();
    }
    print(node[2]);
    if (!emitsBracesAnyhow) {
      indent--;
      newline();
      emit('}');
    }
    if (ifHasElse(node)) {
      space();
      emit("else");
      safeSpace();
      bool emitsBracesAnyhow = isBlock(node[3]);
      if (!emitsBracesAnyhow) {
        emit('{');
        indent++;
        newline();
      }
      print(node[3]);
      if (!emitsBracesAnyhow) {
        indent--;
        newline();
        emit('}');
      }
    }
  }